

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magnet_uri.cpp
# Opt level: O0

string * __thiscall
libtorrent::make_magnet_uri_abi_cxx11_
          (string *__return_storage_ptr__,libtorrent *this,torrent_handle *handle)

{
  bool bVar1;
  ulong uVar2;
  size_t in_RCX;
  span<const_char> in;
  string_view str;
  string_view str_00;
  string_view str_01;
  libtorrent *local_3d8;
  char *local_3d0;
  string local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  iterator __end1_1;
  iterator __begin1_1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_1;
  char *local_350;
  string local_348;
  reference local_328;
  announce_entry *tr;
  iterator __end1;
  iterator __begin1;
  vector<libtorrent::announce_entry,_std::allocator<libtorrent::announce_entry>_> *__range1;
  char *local_2e8;
  string local_2e0;
  undefined4 local_2bc;
  undefined1 local_2b8 [8];
  torrent_status st;
  char *local_78;
  string local_70;
  sha1_hash local_4c;
  digest32<160L> *local_38;
  sha1_hash *ih;
  allocator<char> local_19;
  libtorrent *local_18;
  torrent_handle *handle_local;
  string *ret;
  
  local_18 = this;
  handle_local = (torrent_handle *)__return_storage_ptr__;
  bVar1 = torrent_handle::is_valid((torrent_handle *)this);
  if (bVar1) {
    ih._3_1_ = 0;
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    torrent_handle::info_hash(&local_4c,(torrent_handle *)local_18);
    local_38 = &local_4c;
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"magnet:?xt=urn:btih:");
    span<char_const>::span<libtorrent::digest32<160l>,char,void>
              ((span<char_const> *)&st.flags,local_38);
    in.m_len = in_RCX;
    in.m_ptr = local_78;
    aux::to_hex_abi_cxx11_(&local_70,(aux *)st.flags.m_val,in);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    local_2bc = 0x40;
    torrent_handle::status
              ((torrent_status *)local_2b8,(torrent_handle *)local_18,(status_flags_t)0x40);
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"&dn=");
      boost::basic_string_view<char,std::char_traits<char>>::basic_string_view<std::allocator<char>>
                ((basic_string_view<char,std::char_traits<char>> *)&__range1,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&st.save_path.field_2 + 8));
      str.len_ = in_RCX;
      str.ptr_ = local_2e8;
      escape_string_abi_cxx11_(&local_2e0,(libtorrent *)__range1,str);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_2e0);
      std::__cxx11::string::~string((string *)&local_2e0);
    }
    torrent_handle::trackers
              ((vector<libtorrent::announce_entry,_std::allocator<libtorrent::announce_entry>_> *)
               &__begin1,(torrent_handle *)local_18);
    __end1 = std::vector<libtorrent::announce_entry,_std::allocator<libtorrent::announce_entry>_>::
             begin((vector<libtorrent::announce_entry,_std::allocator<libtorrent::announce_entry>_>
                    *)&__begin1);
    tr = (announce_entry *)
         std::vector<libtorrent::announce_entry,_std::allocator<libtorrent::announce_entry>_>::end
                   ((vector<libtorrent::announce_entry,_std::allocator<libtorrent::announce_entry>_>
                     *)&__begin1);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<libtorrent::announce_entry_*,_std::vector<libtorrent::announce_entry,_std::allocator<libtorrent::announce_entry>_>_>
                                       *)&tr), bVar1) {
      local_328 = __gnu_cxx::
                  __normal_iterator<libtorrent::announce_entry_*,_std::vector<libtorrent::announce_entry,_std::allocator<libtorrent::announce_entry>_>_>
                  ::operator*(&__end1);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"&tr=");
      boost::basic_string_view<char,std::char_traits<char>>::basic_string_view<std::allocator<char>>
                ((basic_string_view<char,std::char_traits<char>> *)&__range1_1,&local_328->url);
      str_00.len_ = in_RCX;
      str_00.ptr_ = local_350;
      escape_string_abi_cxx11_(&local_348,(libtorrent *)__range1_1,str_00);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_348);
      std::__cxx11::string::~string((string *)&local_348);
      __gnu_cxx::
      __normal_iterator<libtorrent::announce_entry_*,_std::vector<libtorrent::announce_entry,_std::allocator<libtorrent::announce_entry>_>_>
      ::operator++(&__end1);
    }
    std::vector<libtorrent::announce_entry,_std::allocator<libtorrent::announce_entry>_>::~vector
              ((vector<libtorrent::announce_entry,_std::allocator<libtorrent::announce_entry>_> *)
               &__begin1);
    torrent_handle::url_seeds_abi_cxx11_
              ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&__begin1_1,(torrent_handle *)local_18);
    __end1_1 = std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&__begin1_1);
    s = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&__begin1_1);
    while (bVar1 = std::operator!=(&__end1_1,(_Self *)&s), bVar1) {
      local_3a8 = std::
                  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator*(&__end1_1);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"&ws=");
      boost::basic_string_view<char,std::char_traits<char>>::basic_string_view<std::allocator<char>>
                ((basic_string_view<char,std::char_traits<char>> *)&local_3d8,local_3a8);
      str_01.len_ = in_RCX;
      str_01.ptr_ = local_3d0;
      escape_string_abi_cxx11_(&local_3c8,local_3d8,str_01);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_3c8);
      std::__cxx11::string::~string((string *)&local_3c8);
      std::
      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end1_1);
    }
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&__begin1_1);
    ih._3_1_ = 1;
    torrent_status::~torrent_status((torrent_status *)local_2b8);
    if ((ih._3_1_ & 1) == 0) {
      std::__cxx11::string::~string((string *)__return_storage_ptr__);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_19);
    std::allocator<char>::~allocator(&local_19);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string make_magnet_uri(torrent_handle const& handle)
	{
		if (!handle.is_valid()) return "";

		std::string ret;
		sha1_hash const& ih = handle.info_hash();
		ret += "magnet:?xt=urn:btih:";
		ret += aux::to_hex(ih);

		torrent_status st = handle.status(torrent_handle::query_name);
		if (!st.name.empty())
		{
			ret += "&dn=";
			ret += escape_string(st.name);
		}

		for (auto const& tr : handle.trackers())
		{
			ret += "&tr=";
			ret += escape_string(tr.url);
		}

		for (auto const& s : handle.url_seeds())
		{
			ret += "&ws=";
			ret += escape_string(s);
		}

		return ret;
	}